

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

Logger * __thiscall higan::Logger::operator<<(Logger *this,string *str)

{
  Logger *pLVar1;
  
  pLVar1 = operator<<(this,(str->_M_dataplus)._M_p);
  return pLVar1;
}

Assistant:

Logger& Logger::operator<<(const std::string& str)
{
	return *this << str.c_str();
}